

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcp.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c7e9::BlockCopyWrapper::BlockCopyWrapper
          (BlockCopyWrapper *this,string *data_type,int input_start_number,int input_end_number,
          int input_block_length,int output_start_number,int output_block_length,double pad_value)

{
  bool bVar1;
  BlockCopy<float> *this_00;
  void *pvVar2;
  undefined8 *in_RDI;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  int24_t *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  int iVar3;
  undefined1 uVar4;
  double in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  BlockCopy<long_double> *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  BlockCopy<sptk::uint24_t> *in_stack_ffffffffffffff30;
  uint24_t local_3b;
  undefined1 local_38;
  int24_t local_37 [18];
  
  *in_RDI = 0;
  bVar1 = std::operator==((char *)in_stack_ffffffffffffff00,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  iVar3 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  if (bVar1) {
    pvVar2 = operator_new(0x20);
    BlockCopy<signed_char>::BlockCopy
              ((BlockCopy<signed_char> *)in_stack_ffffffffffffff20,
               (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),(int)in_stack_ffffffffffffff18,
               (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),SUB84(in_stack_ffffffffffffff10,0),
               iVar3,(double)in_stack_ffffffffffffff00,
               SUB41((uint)in_stack_fffffffffffffefc >> 0x18,0));
    *in_RDI = pvVar2;
  }
  else {
    bVar1 = std::operator==((char *)in_stack_ffffffffffffff00,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    iVar3 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
    if (bVar1) {
      pvVar2 = operator_new(0x20);
      BlockCopy<short>::BlockCopy
                ((BlockCopy<short> *)in_stack_ffffffffffffff20,
                 (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),(int)in_stack_ffffffffffffff18,
                 (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),SUB84(in_stack_ffffffffffffff10,0),
                 iVar3,(double)in_stack_ffffffffffffff00,
                 SUB41((uint)in_stack_fffffffffffffefc >> 0x18,0));
      *in_RDI = pvVar2;
    }
    else {
      bVar1 = std::operator==((char *)in_stack_ffffffffffffff00,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      if (bVar1) {
        pvVar2 = operator_new(0x20);
        iVar3 = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
        uVar4 = (undefined1)((ulong)in_stack_ffffffffffffff08 >> 0x38);
        local_38 = 1;
        sptk::int24_t::int24_t<double>
                  (in_stack_ffffffffffffff00,
                   (double)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        sptk::int24_t::operator_cast_to_int(local_37);
        BlockCopy<sptk::int24_t>::BlockCopy
                  ((BlockCopy<sptk::int24_t> *)in_stack_ffffffffffffff30,
                   (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),(int)in_stack_ffffffffffffff28,
                   (int)((ulong)in_stack_ffffffffffffff20 >> 0x20),(int)in_stack_ffffffffffffff20,
                   iVar3,in_stack_ffffffffffffff10,(bool)uVar4);
        local_38 = 0;
        *in_RDI = pvVar2;
        sptk::int24_t::~int24_t(local_37);
      }
      else {
        bVar1 = std::operator==((char *)in_stack_ffffffffffffff00,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        iVar3 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
        if (bVar1) {
          pvVar2 = operator_new(0x28);
          BlockCopy<int>::BlockCopy
                    ((BlockCopy<int> *)in_stack_ffffffffffffff20,
                     (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),(int)in_stack_ffffffffffffff18,
                     (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                     SUB84(in_stack_ffffffffffffff10,0),iVar3,(double)in_stack_ffffffffffffff00,
                     SUB41((uint)in_stack_fffffffffffffefc >> 0x18,0));
          *in_RDI = pvVar2;
        }
        else {
          bVar1 = std::operator==((char *)in_stack_ffffffffffffff00,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          iVar3 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
          if (bVar1) {
            pvVar2 = operator_new(0x30);
            BlockCopy<long>::BlockCopy
                      ((BlockCopy<long> *)in_stack_ffffffffffffff20,
                       (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                       (int)in_stack_ffffffffffffff18,
                       (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                       SUB84(in_stack_ffffffffffffff10,0),iVar3,(double)in_stack_ffffffffffffff00,
                       SUB41((uint)in_stack_fffffffffffffefc >> 0x18,0));
            *in_RDI = pvVar2;
          }
          else {
            bVar1 = std::operator==((char *)in_stack_ffffffffffffff00,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
                                   );
            iVar3 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
            if (bVar1) {
              pvVar2 = operator_new(0x20);
              BlockCopy<unsigned_char>::BlockCopy
                        ((BlockCopy<unsigned_char> *)in_stack_ffffffffffffff20,
                         (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                         (int)in_stack_ffffffffffffff18,
                         (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                         SUB84(in_stack_ffffffffffffff10,0),iVar3,(double)in_stack_ffffffffffffff00,
                         SUB41((uint)in_stack_fffffffffffffefc >> 0x18,0));
              *in_RDI = pvVar2;
            }
            else {
              bVar1 = std::operator==((char *)in_stack_ffffffffffffff00,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_fffffffffffffefc,
                                                  in_stack_fffffffffffffef8));
              iVar3 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
              if (bVar1) {
                pvVar2 = operator_new(0x20);
                BlockCopy<unsigned_short>::BlockCopy
                          ((BlockCopy<unsigned_short> *)in_stack_ffffffffffffff20,
                           (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                           (int)in_stack_ffffffffffffff18,
                           (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                           SUB84(in_stack_ffffffffffffff10,0),iVar3,
                           (double)in_stack_ffffffffffffff00,
                           SUB41((uint)in_stack_fffffffffffffefc >> 0x18,0));
                *in_RDI = pvVar2;
              }
              else {
                bVar1 = std::operator==((char *)in_stack_ffffffffffffff00,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT44(in_stack_fffffffffffffefc,
                                                    in_stack_fffffffffffffef8));
                iVar3 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
                if (bVar1) {
                  pvVar2 = operator_new(0x20);
                  iVar3 = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
                  uVar4 = (undefined1)((ulong)in_stack_ffffffffffffff08 >> 0x38);
                  sptk::uint24_t::uint24_t<double>
                            ((uint24_t *)in_stack_ffffffffffffff00,
                             (double)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
                  sptk::uint24_t::operator_cast_to_int(&local_3b);
                  BlockCopy<sptk::uint24_t>::BlockCopy
                            (in_stack_ffffffffffffff30,
                             (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                             (int)in_stack_ffffffffffffff28,
                             (int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                             (int)in_stack_ffffffffffffff20,iVar3,in_stack_ffffffffffffff10,
                             (bool)uVar4);
                  *in_RDI = pvVar2;
                  sptk::uint24_t::~uint24_t(&local_3b);
                }
                else {
                  bVar1 = std::operator==((char *)in_stack_ffffffffffffff00,
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT44(in_stack_fffffffffffffefc,
                                                      in_stack_fffffffffffffef8));
                  if (bVar1) {
                    pvVar2 = operator_new(0x28);
                    BlockCopy<unsigned_int>::BlockCopy
                              ((BlockCopy<unsigned_int> *)in_stack_ffffffffffffff20,
                               (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                               (int)in_stack_ffffffffffffff18,
                               (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                               SUB84(in_stack_ffffffffffffff10,0),iVar3,
                               (double)in_stack_ffffffffffffff00,
                               SUB41((uint)in_stack_fffffffffffffefc >> 0x18,0));
                    *in_RDI = pvVar2;
                  }
                  else {
                    bVar1 = std::operator==((char *)in_stack_ffffffffffffff00,
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT44(in_stack_fffffffffffffefc,
                                                        in_stack_fffffffffffffef8));
                    if (bVar1) {
                      pvVar2 = operator_new(0x30);
                      BlockCopy<unsigned_long>::BlockCopy
                                ((BlockCopy<unsigned_long> *)in_stack_ffffffffffffff20,
                                 (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                                 (int)in_stack_ffffffffffffff18,
                                 (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                                 SUB84(in_stack_ffffffffffffff10,0),iVar3,
                                 (double)in_stack_ffffffffffffff00,
                                 SUB41((uint)in_stack_fffffffffffffefc >> 0x18,0));
                      *in_RDI = pvVar2;
                    }
                    else {
                      bVar1 = std::operator==((char *)in_stack_ffffffffffffff00,
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)CONCAT44(in_stack_fffffffffffffefc,
                                                          in_stack_fffffffffffffef8));
                      if (bVar1) {
                        this_00 = (BlockCopy<float> *)operator_new(0x28);
                        BlockCopy<float>::BlockCopy
                                  (this_00,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                                   (int)in_stack_ffffffffffffff18,
                                   (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                                   SUB84(in_stack_ffffffffffffff10,0),iVar3,
                                   (double)in_stack_ffffffffffffff00,
                                   SUB41((uint)in_stack_fffffffffffffefc >> 0x18,0));
                        *in_RDI = this_00;
                      }
                      else {
                        bVar1 = std::operator==((char *)in_stack_ffffffffffffff00,
                                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)CONCAT44(in_stack_fffffffffffffefc,
                                                            in_stack_fffffffffffffef8));
                        if (bVar1) {
                          pvVar2 = operator_new(0x30);
                          BlockCopy<double>::BlockCopy
                                    ((BlockCopy<double> *)in_stack_ffffffffffffff20,
                                     (int)((ulong)pvVar2 >> 0x20),(int)pvVar2,
                                     (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                                     SUB84(in_stack_ffffffffffffff10,0),iVar3,
                                     (double)in_stack_ffffffffffffff00,
                                     SUB41((uint)in_stack_fffffffffffffefc >> 0x18,0));
                          *in_RDI = pvVar2;
                        }
                        else {
                          bVar1 = std::operator==((char *)in_stack_ffffffffffffff00,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT44(in_stack_fffffffffffffefc,
                                                             in_stack_fffffffffffffef8));
                          if (bVar1) {
                            pvVar2 = operator_new(0x40);
                            BlockCopy<long_double>::BlockCopy
                                      (in_stack_ffffffffffffff20,
                                       (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                                       (int)in_stack_ffffffffffffff18,(int)((ulong)pvVar2 >> 0x20),
                                       (int)pvVar2,iVar3,(double)in_stack_ffffffffffffff00,
                                       SUB41((uint)in_stack_fffffffffffffefc >> 0x18,0));
                            *in_RDI = pvVar2;
                          }
                          else {
                            bVar1 = std::operator==((char *)in_stack_ffffffffffffff00,
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT44(in_stack_fffffffffffffefc,
                                                             in_stack_fffffffffffffef8));
                            uVar4 = (undefined1)((uint)in_stack_fffffffffffffefc >> 0x18);
                            if (bVar1) {
                              pvVar2 = operator_new(0x40);
                              BlockCopy<long_double>::BlockCopy
                                        (in_stack_ffffffffffffff20,
                                         (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                                         (int)in_stack_ffffffffffffff18,
                                         (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                                         SUB84(in_stack_ffffffffffffff10,0),
                                         (int)((ulong)pvVar2 >> 0x20),
                                         (double)in_stack_ffffffffffffff00,(bool)uVar4);
                              *in_RDI = pvVar2;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

BlockCopyWrapper(const std::string& data_type, int input_start_number,
                   int input_end_number, int input_block_length,
                   int output_start_number, int output_block_length,
                   double pad_value)
      : block_copy_(NULL) {
    if ("c" == data_type) {
      block_copy_ = new BlockCopy<std::int8_t>(
          input_start_number, input_end_number, input_block_length,
          output_start_number, output_block_length, pad_value);
    } else if ("s" == data_type) {
      block_copy_ = new BlockCopy<std::int16_t>(
          input_start_number, input_end_number, input_block_length,
          output_start_number, output_block_length, pad_value);
    } else if ("h" == data_type) {
      block_copy_ = new BlockCopy<sptk::int24_t>(
          input_start_number, input_end_number, input_block_length,
          output_start_number, output_block_length, sptk::int24_t(pad_value));
    } else if ("i" == data_type) {
      block_copy_ = new BlockCopy<std::int32_t>(
          input_start_number, input_end_number, input_block_length,
          output_start_number, output_block_length, pad_value);
    } else if ("l" == data_type) {
      block_copy_ = new BlockCopy<std::int64_t>(
          input_start_number, input_end_number, input_block_length,
          output_start_number, output_block_length, pad_value);
    } else if ("C" == data_type) {
      block_copy_ = new BlockCopy<std::uint8_t>(
          input_start_number, input_end_number, input_block_length,
          output_start_number, output_block_length, pad_value);
    } else if ("S" == data_type) {
      block_copy_ = new BlockCopy<std::uint16_t>(
          input_start_number, input_end_number, input_block_length,
          output_start_number, output_block_length, pad_value);
    } else if ("H" == data_type) {
      block_copy_ = new BlockCopy<sptk::uint24_t>(
          input_start_number, input_end_number, input_block_length,
          output_start_number, output_block_length, sptk::uint24_t(pad_value));
    } else if ("I" == data_type) {
      block_copy_ = new BlockCopy<std::uint32_t>(
          input_start_number, input_end_number, input_block_length,
          output_start_number, output_block_length, pad_value);
    } else if ("L" == data_type) {
      block_copy_ = new BlockCopy<std::uint64_t>(
          input_start_number, input_end_number, input_block_length,
          output_start_number, output_block_length, pad_value);
    } else if ("f" == data_type) {
      block_copy_ = new BlockCopy<float>(
          input_start_number, input_end_number, input_block_length,
          output_start_number, output_block_length, pad_value);
    } else if ("d" == data_type) {
      block_copy_ = new BlockCopy<double>(
          input_start_number, input_end_number, input_block_length,
          output_start_number, output_block_length, pad_value);
    } else if ("e" == data_type) {
      block_copy_ = new BlockCopy<long double>(
          input_start_number, input_end_number, input_block_length,
          output_start_number, output_block_length, pad_value);
    } else if ("a" == data_type) {
      block_copy_ = new BlockCopy<long double>(
          input_start_number, input_end_number, input_block_length,
          output_start_number, output_block_length, pad_value, true);
    }
  }